

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall cubeb_resampler_delay_line_Test::TestBody(cubeb_resampler_delay_line_Test *this)

{
  uint32_t chunk_size;
  uint32_t delay_frames;
  uint32_t channel;
  uint32_t in_stack_000000fc;
  uint32_t in_stack_00000100;
  uint32_t in_stack_00000104;
  uint local_14;
  uint local_10;
  uint local_c;
  
  for (local_c = 1; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 4; local_10 < 0x29; local_10 = local_10 + 10) {
      for (local_14 = 10; local_14 < 0x1f; local_14 = local_14 + 1) {
        fprintf(_stderr,"channel: %d, delay_frames: %d, chunk_size: %d\n",(ulong)local_c,
                (ulong)local_10,(ulong)local_14);
        test_delay_lines(in_stack_00000104,in_stack_00000100,in_stack_000000fc);
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, resampler_delay_line)
{
  for (uint32_t channel = 1; channel <= 2; channel++) {
    for (uint32_t delay_frames = 4; delay_frames <= 40; delay_frames+=chunk_increment) {
      for (uint32_t chunk_size = 10; chunk_size <= 30; chunk_size++) {
       fprintf(stderr, "channel: %d, delay_frames: %d, chunk_size: %d\n",
              channel, delay_frames, chunk_size);
        test_delay_lines(delay_frames, channel, chunk_size);
      }
    }
  }
}